

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

void __thiscall
wallet::CWallet::
WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
          (CWallet *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3,
          uint parameters_4)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  uint *in_stack_fffffffffffffea8;
  allocator<char> local_13a [2];
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,fmt,local_13a);
  std::operator+(local_f8,"%s ",&local_118);
  GetDisplayName_abi_cxx11_(&local_138,this);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::
    format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
              (&local_78,(tinyformat *)local_f8[0]._M_dataplus._M_p,(char *)&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000014,parameters_4),in_RCX,in_R8,in_R9,&parameters,
               in_stack_fffffffffffffea8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pLVar3 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x58;
    local_78._M_string_length = 0x6e4fa9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3a4,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }